

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Ptr_t *
Acb_GenerateSignalNames
          (Acb_Ntk_t *p,Vec_Int_t *vDivs,Vec_Int_t *vUsed,int nNodes,Vec_Int_t *vTars,
          Vec_Wec_t *vGates)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p_00;
  Vec_Str_t *p_01;
  Vec_Int_t *p_02;
  void *pvVar4;
  char *pcVar5;
  Vec_Int_t *vGate;
  int nWires;
  int iObj;
  int i;
  Vec_Str_t *vStr;
  Vec_Ptr_t *vRes;
  Vec_Wec_t *vGates_local;
  Vec_Int_t *vTars_local;
  int nNodes_local;
  Vec_Int_t *vUsed_local;
  Vec_Int_t *vDivs_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Vec_IntSize(vUsed);
  p_00 = Vec_PtrStart(iVar1 + nNodes);
  p_01 = Vec_StrAlloc(1000);
  for (nWires = 0; iVar1 = Vec_IntSize(vUsed), nWires < iVar1; nWires = nWires + 1) {
    iVar1 = Vec_IntEntry(vUsed,nWires);
    iVar1 = Vec_IntEntry(vDivs,iVar1);
    pcVar5 = Acb_ObjNameStr(p,iVar1);
    pcVar5 = Abc_UtilStrsav(pcVar5);
    Vec_PtrWriteEntry(p_00,nWires,pcVar5);
  }
  iVar1 = Vec_WecSize(vGates);
  iVar2 = Vec_IntSize(vUsed);
  iVar3 = Vec_IntSize(vTars);
  if (iVar1 != iVar2 + nNodes + iVar3) {
    __assert_fail("Vec_WecSize(vGates) == Vec_IntSize(vUsed) + nNodes + Vec_IntSize(vTars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0x75b,
                  "Vec_Ptr_t *Acb_GenerateSignalNames(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  nWires = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vTars);
    if (iVar1 <= nWires) {
      for (nWires = Vec_IntSize(vUsed); iVar1 = Vec_IntSize(vUsed), nWires < iVar1 + nNodes;
          nWires = nWires + 1) {
        pvVar4 = Vec_PtrEntry(p_00,nWires);
        if (pvVar4 == (void *)0x0) {
          Vec_StrPrintF(p_01,"ww%d");
          Vec_StrPush(p_01,'\0');
          pcVar5 = Vec_StrReleaseArray(p_01);
          Vec_PtrWriteEntry(p_00,nWires,pcVar5);
        }
      }
      Vec_StrFree(p_01);
      return p_00;
    }
    iVar1 = Vec_IntEntry(vTars,nWires);
    iVar2 = Vec_IntSize(vUsed);
    p_02 = Vec_WecEntry(vGates,iVar2 + nNodes + nWires);
    iVar2 = Vec_IntEntry(p_02,0);
    if (iVar2 != 0xb) break;
    iVar2 = Vec_IntEntry(p_02,1);
    pcVar5 = Acb_ObjNameStr(p,iVar1);
    pcVar5 = Abc_UtilStrsav(pcVar5);
    Vec_PtrWriteEntry(p_00,iVar2,pcVar5);
    nWires = nWires + 1;
  }
  __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                ,0x75f,
                "Vec_Ptr_t *Acb_GenerateSignalNames(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
               );
}

Assistant:

Vec_Ptr_t * Acb_GenerateSignalNames( Acb_Ntk_t * p, Vec_Int_t * vDivs, Vec_Int_t * vUsed, int nNodes, Vec_Int_t * vTars, Vec_Wec_t * vGates )
{
    Vec_Ptr_t * vRes = Vec_PtrStart( Vec_IntSize(vUsed) + nNodes );
    Vec_Str_t * vStr = Vec_StrAlloc(1000); int i, iObj, nWires = 1;
    // create input names
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_PtrWriteEntry( vRes, i, Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
    // create names for nodes driving outputs
    assert( Vec_WecSize(vGates) == Vec_IntSize(vUsed) + nNodes + Vec_IntSize(vTars) );
    Vec_IntForEachEntry( vTars, iObj, i )
    {
        Vec_Int_t * vGate = Vec_WecEntry( vGates, Vec_IntSize(vUsed) + nNodes + i );
        assert( Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF );
        Vec_PtrWriteEntry( vRes, Vec_IntEntry(vGate, 1), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
    }
    for ( i = Vec_IntSize(vUsed); i < Vec_IntSize(vUsed) + nNodes; i++ )
        if ( Vec_PtrEntry(vRes, i) == NULL )
        {
            Vec_StrPrintF( vStr, "ww%d", nWires++ );
            Vec_StrPush( vStr, '\0' );
            Vec_PtrWriteEntry( vRes, i, Vec_StrReleaseArray(vStr) );
        }
    Vec_StrFree( vStr );
    return vRes;
}